

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaTeX.cpp
# Opt level: O1

string * __thiscall
Shell::LaTeX::toString_abi_cxx11_
          (string *__return_storage_ptr__,LaTeX *this,TermList *terms,bool single)

{
  TermList *pTVar1;
  ulong uVar2;
  char *pcVar3;
  long *plVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined7 in_register_00000009;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  uint uVar9;
  Int *this_00;
  _Alloc_hider this_01;
  LaTeX *this_02;
  undefined1 auVar10 [16];
  string from;
  string result;
  string to;
  string template_str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  undefined4 local_b0;
  uint local_ac;
  string local_a8;
  string local_88;
  TermList *local_68;
  string local_60;
  string *local_40;
  LaTeX *local_38;
  
  local_38 = this;
  if ((terms->_content & 3) == 2) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    this_01._M_p = " (";
    if (single) {
      this_01._M_p = "";
    }
    local_d0 = local_c0;
    local_b0 = (undefined4)CONCAT71(in_register_00000009,single);
    local_40 = __return_storage_ptr__;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,this_01._M_p,this_01._M_p + (ulong)!single * 2);
    local_68 = terms;
    if ((terms->_content & 3) != 2) {
      local_ac = 1;
      do {
        if ((local_ac & 1) == 0) {
          this_01._M_p = ",";
          std::__cxx11::string::append((char *)&local_d0);
        }
        else {
          local_ac = 0;
        }
        uVar2 = local_68->_content;
        if ((uVar2 & 1) == 0) {
          this_02 = (LaTeX *)Kernel::theory;
          Kernel::Theory::tryGetInterpretedLaTeXName_abi_cxx11_
                    (&local_88,(Theory *)Kernel::theory,*(uint *)(uVar2 + 8),false,true);
          if (local_88._M_string_length == 0) {
            symbolToString_abi_cxx11_(&local_a8,this_02,*(uint *)(uVar2 + 8),false);
            toString_abi_cxx11_(&local_60,local_38,
                                (TermList *)
                                ((ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff) * 8 + 0x28 + uVar2),
                                false);
            uVar8 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              uVar8 = local_a8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar8 < local_60._M_string_length + local_a8._M_string_length) {
              uVar8 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_60._M_dataplus._M_p != &local_60.field_2) {
                uVar8 = local_60.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar8 < local_60._M_string_length + local_a8._M_string_length)
              goto LAB_0070b244;
              puVar6 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_60,0,(char *)0x0,(ulong)local_a8._M_dataplus._M_p);
            }
            else {
LAB_0070b244:
              puVar6 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_a8,(ulong)local_60._M_dataplus._M_p);
            }
            local_f0 = &local_e0;
            paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(puVar6 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar6 == paVar7) {
              local_e0._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_e0._8_8_ = puVar6[3];
            }
            else {
              local_e0._M_allocated_capacity = paVar7->_M_allocated_capacity;
              local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)*puVar6;
            }
            *puVar6 = paVar7;
            puVar6[1] = 0;
            paVar7->_M_local_buf[0] = '\0';
            this_01._M_p = (pointer)local_f0;
            std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0);
            if (local_f0 != &local_e0) {
              this_01._M_p = (pointer)(local_e0._M_allocated_capacity + 1);
              operator_delete(local_f0,(ulong)this_01._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_60._M_dataplus._M_p != &local_60.field_2) {
              this_01._M_p = (pointer)(local_60.field_2._M_allocated_capacity + 1);
              operator_delete(local_60._M_dataplus._M_p,(ulong)this_01._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              this_01._M_p = (pointer)(local_a8.field_2._M_allocated_capacity + 1);
              operator_delete(local_a8._M_dataplus._M_p,(ulong)this_01._M_p);
            }
          }
          else {
            if ((*(uint *)(uVar2 + 0xc) & 0xfffffff) != 0) {
              this_00 = (Int *)0x0;
              uVar8 = extraout_RDX;
              do {
                ::Lib::Int::toString_abi_cxx11_(&local_a8,this_00,(uint)uVar8);
                plVar4 = (long *)std::__cxx11::string::replace
                                           ((ulong)&local_a8,0,(char *)0x0,0x93046d);
                local_f0 = &local_e0;
                paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)(plVar4 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar4 == paVar7) {
                  local_e0._M_allocated_capacity = paVar7->_M_allocated_capacity;
                  local_e0._8_8_ = plVar4[3];
                }
                else {
                  local_e0._M_allocated_capacity = paVar7->_M_allocated_capacity;
                  local_f0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)*plVar4;
                }
                pcVar3 = (char *)plVar4[1];
                *plVar4 = (long)paVar7;
                plVar4[1] = 0;
                *(undefined1 *)(plVar4 + 2) = 0;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                }
                toString_abi_cxx11_(&local_a8,local_38,
                                    (TermList *)
                                    (uVar2 + 0x28 +
                                    ((ulong)(*(uint *)(uVar2 + 0xc) & 0xfffffff) -
                                    (long)(int)this_00) * 8),true);
                auVar10 = std::__cxx11::string::find((char *)&local_88,(ulong)local_f0,0);
                lVar5 = auVar10._0_8_;
                while( true ) {
                  uVar8 = auVar10._8_8_;
                  if (lVar5 == -1) break;
                  std::__cxx11::string::replace
                            ((ulong)&local_88,auVar10._0_8_,pcVar3,(ulong)local_a8._M_dataplus._M_p)
                  ;
                  auVar10 = std::__cxx11::string::find
                                      ((char *)&local_88,(ulong)local_f0,
                                       auVar10._0_8_ + local_a8._M_string_length);
                  lVar5 = auVar10._0_8_;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                  operator_delete(local_a8._M_dataplus._M_p,
                                  local_a8.field_2._M_allocated_capacity + 1);
                  uVar8 = extraout_RDX_00;
                }
                if (local_f0 != &local_e0) {
                  operator_delete(local_f0,local_e0._M_allocated_capacity + 1);
                  uVar8 = extraout_RDX_01;
                }
                uVar9 = (int)this_00 + 1;
                this_00 = (Int *)(ulong)uVar9;
              } while (uVar9 < (*(uint *)(uVar2 + 0xc) & 0xfffffff));
            }
            this_01._M_p = local_88._M_dataplus._M_p;
            std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_88._M_dataplus._M_p);
          }
        }
        else {
          varToString_abi_cxx11_(&local_88,(LaTeX *)this_01._M_p,(uint)(uVar2 >> 2));
          this_01._M_p = local_88._M_dataplus._M_p;
          std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_88._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          this_01._M_p = (pointer)(local_88.field_2._M_allocated_capacity + 1);
          operator_delete(local_88._M_dataplus._M_p,(ulong)this_01._M_p);
        }
        if ((char)local_b0 != '\0') goto LAB_0070af32;
        pTVar1 = local_68 + -1;
        local_68 = local_68 + -1;
      } while ((pTVar1->_content & 3) != 2);
    }
    __return_storage_ptr__ = local_40;
    if ((char)local_b0 == '\0') {
      (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,local_d0,local_c8 + (long)local_d0);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
LAB_0070af32:
      __return_storage_ptr__ = local_40;
      (local_40->_M_dataplus)._M_p = (pointer)&local_40->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_40,local_d0,local_c8 + (long)local_d0);
    }
    if (local_d0 != local_c0) {
      operator_delete(local_d0,local_c0[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LaTeX::toString (TermList* terms,bool single) const
{
  if (terms->isEmpty()) {
    return "";
  }

  std::string result = single ? "" : " (";
  bool first=true;
  TermList* t=terms;
  while(t->isNonEmpty()) {

    if(first){
      first=false;
    }
    else{
        result += ",";
    }

//   if (_map) {
//     std::string result;
//     if (_map->toString(t,*this,result)) {
//       return result;
//     }
//   }
    if(t->isVar()) {
      ASS(t->isOrdinaryVar());
      result += varToString(t->var()); 
    }
    else {
      ASS(t->isTerm());
      Term* trm=t->term();

     //Check if this symbol has an interpreted LaTeX name
     // this should be true for all known interpreted symbols and any recorded symbols
      std::string template_str = theory->tryGetInterpretedLaTeXName(trm->functor(),false);
   
      if(template_str.empty()){
        result += symbolToString(trm->functor(), false) + toString(trm->args());
      }
      else{
        // replace arguments in the template, arg0 replaces a0 etc.
        for(unsigned i=0;i<trm->arity();i++){
          std::string from = "a"+Lib::Int::toString(i);
          std::string to = toString(trm->nthArgument(i),true);
          size_t start_pos = 0;
          while((start_pos = template_str.find(from, start_pos)) != std::string::npos) {
            template_str.replace(start_pos, from.length(), to);
            start_pos += to.length();
          }
        }
        result += template_str;
      }
    }

    if(single) break;
    t=t->next();
  }
  return single? result : result + ")";
}